

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_685c1::IntrusiveListIteratorTest::SetUp(IntrusiveListIteratorTest *this)

{
  size_t sVar1;
  TestObject *node_p_1;
  TestObject *pTVar2;
  TestObject *pTVar3;
  TestObject *node_p;
  
  pTVar2 = (TestObject *)operator_new(0x20);
  (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ = (TestObject *)0x0;
  pTVar2->data = 1;
  pTVar2->data2 = 0;
  pTVar2->moved = false;
  pTVar3 = (this->list_).last_;
  if (pTVar3 == (TestObject *)0x0) {
    pTVar3 = (TestObject *)&this->list_;
  }
  else {
    (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ = pTVar3;
  }
  (pTVar3->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ = pTVar2;
  sVar1 = (this->list_).size_;
  pTVar3 = (TestObject *)operator_new(0x20);
  pTVar3->data = 2;
  pTVar3->data2 = 0;
  pTVar3->moved = false;
  (pTVar3->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ = pTVar2;
  (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ = pTVar3;
  pTVar2 = (TestObject *)operator_new(0x20);
  (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ = (TestObject *)0x0;
  pTVar2->data = 3;
  pTVar2->data2 = 0;
  pTVar2->moved = false;
  (anonymous_namespace)::TestObject::creation_count = 3;
  (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ = pTVar3;
  (pTVar3->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ = pTVar2;
  (this->list_).last_ = pTVar2;
  (this->list_).size_ = sVar1 + 3;
  return;
}

Assistant:

virtual void SetUp() {
    IntrusiveListTest::SetUp();

    list_.emplace_back(1);
    list_.emplace_back(2);
    list_.emplace_back(3);
  }